

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_modelWithUnits_Test::~Clone_modelWithUnits_Test(Clone_modelWithUnits_Test *this)

{
  Clone_modelWithUnits_Test *this_local;
  
  ~Clone_modelWithUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, modelWithUnits)
{
    auto m = libcellml::Model::create();
    auto u = libcellml::Units::create();

    u->setName("jangle");
    m->setId("unique_model");
    m->setName("model");

    m->addUnits(u);

    auto mClone = m->clone();

    compareModel(m, mClone);
}